

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char cVar2;
  _Bool _Var3;
  long *plVar4;
  char command;
  FTP *ftp;
  char *type;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  plVar4 = (long *)(*Curl_ccalloc)(0x38,1);
  (conn->data->req).protop = plVar4;
  if (plVar4 == (long *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    plVar4[3] = (long)((pCVar1->state).up.path + 1);
    (pCVar1->state).slash_removed = true;
    ftp = (FTP *)strstr((char *)plVar4[3],";type=");
    if (ftp == (FTP *)0x0) {
      ftp = (FTP *)strstr((conn->host).rawalloc,";type=");
    }
    if (ftp != (FTP *)0x0) {
      *(undefined1 *)&ftp->bytecountp = 0;
      cVar2 = Curl_raw_toupper(*(char *)((long)&ftp->bytecountp + 6));
      (conn->bits).type_set = true;
      if (cVar2 == 'A') {
        (pCVar1->set).prefer_ascii = true;
      }
      else if (cVar2 == 'D') {
        (pCVar1->set).ftp_list_only = true;
      }
      else {
        (pCVar1->set).prefer_ascii = false;
      }
    }
    *plVar4 = (long)&(conn->data->req).bytecount;
    *(undefined4 *)(plVar4 + 5) = 0;
    plVar4[6] = 0;
    plVar4[1] = (long)conn->user;
    plVar4[2] = (long)conn->passwd;
    _Var3 = isBadFtpString((char *)plVar4[1]);
    if (_Var3) {
      conn_local._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      _Var3 = isBadFtpString((char *)plVar4[2]);
      if (_Var3) {
        conn_local._4_4_ = CURLE_URL_MALFORMAT;
      }
      else {
        (conn->proto).ftpc.known_filesize = -1;
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  struct FTP *ftp;

  conn->data->req.protop = ftp = calloc(sizeof(struct FTP), 1);
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */
  data->state.slash_removed = TRUE; /* we've skipped the slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);
    conn->bits.type_set = TRUE;

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->bytecountp = &conn->data->req.bytecount;
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;

  /* No need to duplicate user+password, the connectdata struct won't change
     during a session, but we re-init them here since on subsequent inits
     since the conn struct may have changed or been replaced.
  */
  ftp->user = conn->user;
  ftp->passwd = conn->passwd;
  if(isBadFtpString(ftp->user))
    return CURLE_URL_MALFORMAT;
  if(isBadFtpString(ftp->passwd))
    return CURLE_URL_MALFORMAT;

  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}